

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::CheckerMemberVisitor::handle(CheckerMemberVisitor *this,MemberAccessExpression *expr)

{
  Type *this_00;
  CheckerInstanceBodySymbol *pCVar1;
  Symbol *pSVar2;
  bool bVar3;
  Symbol *pSVar4;
  CheckerInstanceBodySymbol *pCVar5;
  Diagnostic *this_01;
  CheckerInstanceBodySymbol *pCVar6;
  
  this_00 = (expr->value_->type).ptr;
  bVar3 = Type::isFixedSize(this_00);
  if (bVar3) {
    if (this_00->canonical == (Type *)0x0) {
      Type::resolveCanonical(this_00);
    }
    if ((this_00->canonical->super_Symbol).kind != ClassType) goto LAB_001fbc9b;
  }
  bVar3 = Expression::bad(&expr->super_Expression);
  if ((!bVar3) &&
     (pSVar4 = Expression::getSymbolReference(expr->value_,true), pSVar4 != (Symbol *)0x0)) {
    pCVar6 = (CheckerInstanceBodySymbol *)pSVar4->parentScope;
    pCVar1 = this->body;
    pCVar5 = pCVar1;
    if (pCVar1 != (CheckerInstanceBodySymbol *)0x0) {
      pCVar5 = (CheckerInstanceBodySymbol *)&pCVar1->super_Scope;
    }
    while (pCVar6 != (CheckerInstanceBodySymbol *)0x0) {
      if (pCVar6 == pCVar5) goto LAB_001fbc9b;
      pSVar2 = (Symbol *)(pCVar6->super_Symbol).name._M_len;
      if (pSVar2->kind == InstanceBody) break;
      pCVar6 = (CheckerInstanceBodySymbol *)pSVar2->parentScope;
    }
    this_01 = Scope::addDiag(&pCVar1->super_Scope,(DiagCode)0x4b0007,
                             (expr->super_Expression).sourceRange);
    Diagnostic::addNote(this_01,(DiagCode)0x50001,pSVar4->location);
    return;
  }
LAB_001fbc9b:
  Expression::visitExpression<slang::ast::Expression_const,slang::ast::CheckerMemberVisitor&>
            (expr->value_,expr->value_,this);
  return;
}

Assistant:

void handle(const MemberAccessExpression& expr) {
        auto& valueType = *expr.value().type;
        if ((!valueType.isFixedSize() || valueType.isClass()) && !expr.bad()) {
            if (auto sym = expr.value().getSymbolReference(); sym && !isFromChecker(*sym)) {
                auto& diag = body.addDiag(diag::DynamicFromChecker, expr.sourceRange);
                diag.addNote(diag::NoteDeclarationHere, sym->location);
                return;
            }
        }
        visitDefault(expr);
    }